

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunk.c
# Opt level: O0

nng_err chunk_ingest_newline(nni_http_chunks *cl,char c)

{
  size_t sVar1;
  void *item;
  void *pvVar2;
  nni_http_chunk *chunk;
  char c_local;
  nni_http_chunks *cl_local;
  
  if (c == '\n') {
    if (cl->cl_size == 0) {
      cl->cl_line = 0;
      cl->cl_state = CS_TRLR;
      cl_local._4_4_ = NNG_OK;
    }
    else {
      if ((cl->cl_maxsz != 0) &&
         (sVar1 = nni_http_chunks_size(cl), cl->cl_maxsz < sVar1 + cl->cl_size)) {
        return NNG_EMSGSIZE;
      }
      item = nni_zalloc(0x30);
      if (item == (void *)0x0) {
        cl_local._4_4_ = NNG_ENOMEM;
      }
      else {
        pvVar2 = nni_alloc(cl->cl_size + 2);
        *(void **)((long)item + 0x28) = pvVar2;
        if (pvVar2 == (void *)0x0) {
          nni_free(item,0x30);
          cl_local._4_4_ = NNG_ENOMEM;
        }
        else {
          cl->cl_state = CS_DATA;
          *(size_t *)((long)item + 0x10) = cl->cl_size;
          *(size_t *)((long)item + 0x18) = cl->cl_size + 2;
          *(undefined8 *)((long)item + 0x20) = *(undefined8 *)((long)item + 0x18);
          nni_list_append(&cl->cl_chunks,item);
          cl_local._4_4_ = NNG_OK;
        }
      }
    }
  }
  else {
    cl_local._4_4_ = NNG_EPROTO;
  }
  return cl_local._4_4_;
}

Assistant:

static nng_err
chunk_ingest_newline(nni_http_chunks *cl, char c)
{
	nni_http_chunk *chunk;

	if (c != '\n') {
		return (NNG_EPROTO);
	}
	if (cl->cl_size == 0) {
		cl->cl_line  = 0;
		cl->cl_state = CS_TRLR;
		return (NNG_OK);
	}
	if ((cl->cl_maxsz > 0) &&
	    ((nni_http_chunks_size(cl) + cl->cl_size) > cl->cl_maxsz)) {
		return (NNG_EMSGSIZE);
	}
	if ((chunk = NNI_ALLOC_STRUCT(chunk)) == NULL) {
		return (NNG_ENOMEM);
	}
	// two extra bytes to accommodate trailing CRLF
	if ((chunk->c_data = nni_alloc(cl->cl_size + 2)) == NULL) {
		NNI_FREE_STRUCT(chunk);
		return (NNG_ENOMEM);
	}

	// Data, so allocate a new chunk, stick it on the end of the list,
	// and note that we have residual data needs.  The residual is
	// to allow for the trailing CRLF to be consumed.
	cl->cl_state   = CS_DATA;
	chunk->c_size  = cl->cl_size;
	chunk->c_alloc = cl->cl_size + 2;
	chunk->c_resid = chunk->c_alloc;
	nni_list_append(&cl->cl_chunks, chunk);

	return (NNG_OK);
}